

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

Var Js::JavascriptString::EntryMatch(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  Entry *input;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *pRVar7;
  Var instance;
  JavascriptRegExp *pJVar8;
  int in_stack_00000010;
  undefined1 local_68 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x5ad,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d14ac0;
    *puVar5 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_38);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((local_38._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x5b0,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d14ac0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_68,function,local_38,L"String.prototype.match",
             &stack0x00000000);
  if (((pSVar1->config).threadConfig)->m_ES6RegExSymbols == true) {
    if (((ulong)callInfo_local & 0xffffff) == 0) {
LAB_00d14ac2:
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"String.prototype.match");
    }
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    BVar4 = JavascriptConversion::CheckObjectCoercible(pvVar6,pSVar1);
    if (BVar4 == 0) goto LAB_00d14ac2;
    if (((ulong)callInfo_local & 0xfffffe) != 0) {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      BVar4 = JavascriptOperators::IsUndefinedOrNull(pvVar6);
      if (BVar4 == 0) {
        pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        pRVar7 = JavascriptOperators::ToObject(pvVar6,pSVar1);
        instance = JavascriptOperators::GetPropertyNoCache(pRVar7,0x15,pSVar1);
        BVar4 = JavascriptOperators::IsUndefinedOrNull(instance);
        if (BVar4 == 0) {
          pvVar6 = CallRegExSymbolFunction<1>
                             (instance,pvVar6,(Arguments *)&callInfo_local,L"String.prototype.match"
                              ,pSVar1);
          goto LAB_00d14a8b;
        }
      }
    }
  }
  __tag.entry.next = (Entry *)0x0;
  GetThisStringArgument
            ((ArgumentReader *)&callInfo_local,pSVar1,L"String.prototype.match",
             (JavascriptString **)&__tag.entry.next);
  input = __tag.entry.next;
  if (((ulong)callInfo_local & 0xfffffe) == 0) {
    pRVar7 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pRVar7 = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,1);
  }
  if (((pSVar1->config).threadConfig)->m_ES6RegExSymbols == false) {
    pJVar8 = JavascriptRegExp::CreateRegEx(pRVar7,(Var)0x0,pSVar1);
    bVar3 = RegexHelper::IsResultNotUsed((uint)(byte)local_38._3_1_);
    pvVar6 = RegexHelper::RegexMatch
                       (pSVar1,(RecyclableObject *)pJVar8,(JavascriptString *)input,bVar3,
                        (void *)0x0);
  }
  else {
    pJVar8 = JavascriptRegExp::CreateRegExNoCoerce(pRVar7,(Var)0x0,pSVar1);
    pRVar7 = JavascriptOperators::ToObject(pJVar8,pSVar1);
    pvVar6 = JavascriptOperators::GetPropertyNoCache(pRVar7,0x15,pSVar1);
    pvVar6 = CallRegExSymbolFunction<1>
                       (pvVar6,pJVar8,(Arguments *)&callInfo_local,L"String.prototype.match",pSVar1)
    ;
  }
LAB_00d14a8b:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_68);
  return pvVar6;
}

Assistant:

Var JavascriptString::EntryMatch(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        PCWSTR const varName = _u("String.prototype.match");

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, varName);

        auto fallback = [&](JavascriptString* stringObj)
        {
            Var regExp = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();

            if (!scriptContext->GetConfig()->IsES6RegExSymbolsEnabled())
            {
                JavascriptRegExp * regExObj = JavascriptRegExp::CreateRegEx(regExp, nullptr, scriptContext);
                return RegexHelper::RegexMatch(
                    scriptContext,
                    regExObj,
                    stringObj,
                    RegexHelper::IsResultNotUsed(callInfo.Flags));
            }
            else
            {
                JavascriptRegExp * regExObj = JavascriptRegExp::CreateRegExNoCoerce(regExp, nullptr, scriptContext);
                Var symbolFn = GetRegExSymbolFunction(regExObj, PropertyIds::_symbolMatch, scriptContext);
                return CallRegExSymbolFunction<1>(symbolFn, regExObj, args, varName, scriptContext);
            }
        };
        return DelegateToRegExSymbolFunction<1>(args, PropertyIds::_symbolMatch, fallback, varName, scriptContext);
    }